

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O2

int lj_record_objcmp(jit_State *J,TRef a,TRef b,cTValue *av,cTValue *bv)

{
  int iVar1;
  short sVar2;
  uint uVar3;
  uint uVar4;
  
  iVar1 = lj_obj_equal(av,bv);
  if ((short)((ushort)b | (ushort)a) < 0) {
    uVar3 = a >> 0x18 & 0x1f;
    if (uVar3 - 0xf < 5) {
      uVar3 = 0x13;
    }
    sVar2 = (short)uVar3;
    uVar4 = b >> 0x18 & 0x1f;
    if (uVar4 - 0xf < 5) {
      uVar4 = 0x13;
    }
    if (uVar3 != uVar4) {
      if ((uVar3 == 0x13) && (uVar4 == 0xe)) {
        (J->fold).ins.field_0.op1 = (ushort)a;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x590e01d3;
        a = lj_opt_fold(J);
      }
      else {
        if (uVar3 != 0xe) {
          return 2;
        }
        if (uVar4 != 0x13) {
          return 2;
        }
        (J->fold).ins.field_0.op1 = (ushort)b;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x590e01d3;
        b = lj_opt_fold(J);
      }
      sVar2 = 0xe;
    }
    (J->fold).ins.field_0.ot = (ushort)(iVar1 == 0) * 0x100 + sVar2 + 0x880;
    (J->fold).ins.field_0.op1 = (IRRef1)a;
    (J->fold).ins.field_0.op2 = (IRRef1)b;
    lj_opt_fold(J);
  }
  return (uint)(iVar1 == 0);
}

Assistant:

int lj_record_objcmp(jit_State *J, TRef a, TRef b, cTValue *av, cTValue *bv)
{
  int diff = !lj_obj_equal(av, bv);
  if (!tref_isk2(a, b)) {  /* Shortcut, also handles primitives. */
    IRType ta = tref_isinteger(a) ? IRT_INT : tref_type(a);
    IRType tb = tref_isinteger(b) ? IRT_INT : tref_type(b);
    if (ta != tb) {
      /* Widen mixed number/int comparisons to number/number comparison. */
      if (ta == IRT_INT && tb == IRT_NUM) {
	a = emitir(IRTN(IR_CONV), a, IRCONV_NUM_INT);
	ta = IRT_NUM;
      } else if (ta == IRT_NUM && tb == IRT_INT) {
	b = emitir(IRTN(IR_CONV), b, IRCONV_NUM_INT);
      } else {
	return 2;  /* Two different types are never equal. */
      }
    }
    emitir(IRTG(diff ? IR_NE : IR_EQ, ta), a, b);
  }
  return diff;
}